

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O3

bool __thiscall gl4cts::GetTextureSubImage::Errors::testNegativeOffsetError(Errors *this)

{
  int iVar1;
  int value;
  undefined4 extraout_var;
  char *pcVar2;
  size_t sVar3;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  (*this->m_gl_GetTextureSubImage)
            (this->m_texture_2D,0,-1,0,0,2,2,1,0x1908,0x1401,0x10,this->m_destination_buffer);
  value = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (value != 0x501) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "GL_INVALID_VALUE error is expected to be generated by glGetTextureSubImage if xoffset, yoffset or zoffset are negative (OpenGL 4.5 Core Specification chapter 8.11.4)."
               ,0xa6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," However, the error value ",0x1a);
    pcVar2 = glu::getErrorName(value);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," was generated.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  (*this->m_gl_GetCompressedTextureSubImage)
            (this->m_texture_2D_compressed,0,-1,0,0,4,4,1,0x10,this->m_destination_buffer);
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (iVar1 != 0x501) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "GL_INVALID_VALUE error is expected to be generated by glGetCompressedTextureSubImage if xoffset, yoffset or zoffset are negative (OpenGL 4.5 Core Specification chapter 8.11.4)."
               ,0xb0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," However, the error value ",0x1a);
    pcVar2 = glu::getErrorName(iVar1);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," was generated.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return value == 0x501 && iVar1 == 0x501;
}

Assistant:

bool gl4cts::GetTextureSubImage::Errors::testNegativeOffsetError()
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test. */
	m_gl_GetTextureSubImage(m_texture_2D, 0, -1, 0, 0, s_texture_data_width, s_texture_data_height, 1, GL_RGBA,
							GL_UNSIGNED_BYTE, s_destination_buffer_size, m_destination_buffer);

	glw::GLint error_value	 = gl.getError();
	glw::GLint is_proper_error = (GL_INVALID_VALUE == error_value);

	if (!is_proper_error)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "GL_INVALID_VALUE error is expected to be generated by glGetTextureSubImage if xoffset, "
							  "yoffset or zoffset are negative (OpenGL 4.5 Core Specification chapter 8.11.4)."
						   << " However, the error value " << glu::getErrorName(error_value) << " was generated."
						   << tcu::TestLog::EndMessage;
	}

	m_gl_GetCompressedTextureSubImage(m_texture_2D_compressed, 0, -1, 0, 0, s_texture_data_compressed_width,
									  s_texture_data_compressed_height, 1, s_destination_buffer_size,
									  m_destination_buffer);

	error_value = gl.getError();

	glw::GLint is_proper_error_compressed = (GL_INVALID_VALUE == error_value);

	if (!is_proper_error_compressed)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "GL_INVALID_VALUE error is expected to be generated by glGetCompressedTextureSubImage if "
							  "xoffset, yoffset or zoffset are negative (OpenGL 4.5 Core Specification chapter 8.11.4)."
						   << " However, the error value " << glu::getErrorName(error_value) << " was generated."
						   << tcu::TestLog::EndMessage;
	}

	if (is_proper_error && is_proper_error_compressed)
	{
		return true;
	}

	return false;
}